

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_rldnm(DisasContext_conflict10 *ctx,int mb,int me)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  TCGTemp *ts;
  ulong arg2;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  arg1_00 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8));
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_andi_i64_ppc64(s,(TCGv_i64)((long)ts - (long)s),arg1_00,0x3f);
  tcg_gen_rotl_i64_ppc64(s,ret,arg1,(TCGv_i64)((long)ts - (long)s));
  tcg_temp_free_internal_ppc64(s,ts);
  if (mb == 0) {
    arg2 = -1L << (~(byte)me & 0x3f);
  }
  else {
    arg2 = 0xffffffffffffffff >> ((byte)mb & 0x3f);
    if ((me != 0x3f) &&
       (arg2 = arg2 ^ 0x7fffffffffffffffU >> ((byte)me & 0x3f), (uint)me < (uint)mb)) {
      arg2 = ~arg2;
    }
  }
  tcg_gen_andi_i64_ppc64(s,ret,ret,arg2);
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  uVar1._0_1_ = ctx->sf_mode;
  uVar1._1_1_ = ctx->has_cfar;
  uVar1._2_1_ = ctx->fpu_enabled;
  uVar1._3_1_ = ctx->altivec_enabled;
  gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  return;
}

Assistant:

static void gen_rldnm(DisasContext *ctx, int mb, int me)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t_rb = cpu_gpr[rB(ctx->opcode)];
    TCGv t0;

    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t0, t_rb, 0x3f);
    tcg_gen_rotl_tl(tcg_ctx, t_ra, t_rs, t0);
    tcg_temp_free(tcg_ctx, t0);

    tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}